

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void tb_flush_jmp_cache_m68k(CPUState *cpu,target_ulong_conflict addr)

{
  target_ulong_conflict addr_local;
  CPUState *cpu_local;
  
  tb_jmp_cache_clear_page(cpu,addr - 0x1000);
  tb_jmp_cache_clear_page(cpu,addr);
  return;
}

Assistant:

void tb_flush_jmp_cache(CPUState *cpu, target_ulong addr)
{
#ifdef TARGET_ARM
    struct uc_struct *uc = cpu->uc;
#endif

    /* Discard jump cache entries for any tb which might potentially
       overlap the flushed page.  */
    tb_jmp_cache_clear_page(cpu, addr - TARGET_PAGE_SIZE);
    tb_jmp_cache_clear_page(cpu, addr);
}